

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O0

void __thiscall C_matrix<double>::save(C_matrix<double> *this,string *fileName)

{
  double *pdVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  ostream *poVar5;
  ushort local_228;
  ushort local_226;
  unsigned_short j;
  unsigned_short i;
  ostream local_218 [8];
  ofstream myfileX;
  string *fileName_local;
  C_matrix<double> *this_local;
  
  std::ofstream::ofstream(local_218);
  _Var3 = std::__cxx11::string::data();
  std::ofstream::open((char *)local_218,_Var3);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    for (local_226 = 0; (int)(uint)local_226 < this->m_L; local_226 = local_226 + 1) {
      for (local_228 = 0; (int)(uint)local_228 < this->m_C; local_228 = local_228 + 1) {
        pdVar1 = this->m_A;
        iVar4 = getIndex(this,(uint)local_226,(uint)local_228);
        poVar5 = (ostream *)std::ostream::operator<<(local_218,pdVar1[iVar4]);
        std::operator<<(poVar5,"\t");
      }
      std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void C_matrix<dataType>::save(std::string fileName)
{
    std::ofstream myfileX;
    myfileX.open (fileName.data(), std::ios::out );

    if(myfileX.is_open())
    {
        for(unsigned short i=0 ; i<m_L ; i++)
        {
            for(unsigned short j=0 ; j<m_C ; j++)
            {
                myfileX << m_A[getIndex(i,j)] << "\t";
            }
            myfileX << std::endl;
        }
        myfileX.close();
    }
}